

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint local_ac;
  int model;
  bool local_a1;
  UndoHistory history;
  Cmd cmd4;
  Cmd cmd3;
  Cmd cmd2;
  Cmd cmd1;
  
  cmd4.m_model = &model;
  model = 0;
  cmd1.super_UndoCommand._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00103d38;
  cmd1.m_redo_value = 1;
  cmd1.m_undo_value = 0;
  cmd2.super_UndoCommand._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00103d38;
  cmd2.m_redo_value = 2;
  cmd2.m_undo_value = 1;
  cmd3.super_UndoCommand._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00103d38;
  cmd3.m_redo_value = 3;
  cmd3.m_undo_value = 1;
  cmd4.super_UndoCommand._vptr_UndoCommand = (_func_int **)&PTR__UndoCommand_00103d38;
  cmd4.m_redo_value = 4;
  cmd4.m_undo_value = 3;
  cmd3.m_model = cmd4.m_model;
  cmd2.m_model = cmd4.m_model;
  cmd1.m_model = cmd4.m_model;
  undo::UndoHistory::UndoHistory(&history,(UndoHistoryDelegate *)0x0);
  model = 1;
  undo::UndoHistory::add(&history,&cmd1.super_UndoCommand);
  model = 2;
  undo::UndoHistory::add(&history,&cmd2.super_UndoCommand);
  undo::UndoHistory::undo(&history);
  *cmd3.m_model = cmd3.m_redo_value;
  undo::UndoHistory::add(&history,&cmd3.super_UndoCommand);
  *cmd4.m_model = cmd4.m_redo_value;
  undo::UndoHistory::add(&history,&cmd4.super_UndoCommand);
  local_ac = 4;
  expect_eq<int,int>((int *)&local_ac,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x20);
  undo::UndoHistory::undo(&history);
  local_ac = 3;
  expect_eq<int,int>((int *)&local_ac,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x22);
  undo::UndoHistory::undo(&history);
  local_ac = 2;
  expect_eq<int,int>((int *)&local_ac,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x24);
  undo::UndoHistory::undo(&history);
  local_ac = 1;
  expect_eq<int,int>((int *)&local_ac,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x26);
  undo::UndoHistory::undo(&history);
  local_ac = 0;
  expect_eq<int,int>((int *)&local_ac,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x28);
  local_ac = local_ac & 0xffffff00;
  local_a1 = undo::UndoHistory::canUndo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_ac,&local_a1,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp",0x29);
  undo::UndoHistory::redo(&history);
  local_ac = 1;
  expect_eq<int,int>((int *)&local_ac,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x2b);
  undo::UndoHistory::redo(&history);
  local_ac = 2;
  expect_eq<int,int>((int *)&local_ac,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x2d);
  undo::UndoHistory::redo(&history);
  local_ac = 3;
  expect_eq<int,int>((int *)&local_ac,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x2f);
  undo::UndoHistory::redo(&history);
  local_ac = 4;
  expect_eq<int,int>((int *)&local_ac,&model,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp"
                     ,0x31);
  local_ac = local_ac & 0xffffff00;
  local_a1 = undo::UndoHistory::canRedo(&history);
  expect_eq<bool,bool>
            ((bool *)&local_ac,&local_a1,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/tree.cpp",0x32);
  undo::UndoHistory::~UndoHistory(&history);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
  // 1 --- 2
  // |
  //  ------- 3 --- 4
  int model = 0;
  Cmd cmd1(model, 1, 0);
  Cmd cmd2(model, 2, 1);
  Cmd cmd3(model, 3, 1);
  Cmd cmd4(model, 4, 3);

  UndoHistory history;
  cmd1.redo(); history.add(&cmd1);
  cmd2.redo(); history.add(&cmd2);
  history.undo();
  cmd3.redo(); history.add(&cmd3); // Creates a branch in the history
  cmd4.redo(); history.add(&cmd4);

  EXPECT_EQ(4, model);
  history.undo();
  EXPECT_EQ(3, model);
  history.undo();
  EXPECT_EQ(2, model);
  history.undo();
  EXPECT_EQ(1, model);
  history.undo();
  EXPECT_EQ(0,  model);
  EXPECT_FALSE(history.canUndo());
  history.redo();
  EXPECT_EQ(1, model);
  history.redo();
  EXPECT_EQ(2, model);
  history.redo();
  EXPECT_EQ(3, model);
  history.redo();
  EXPECT_EQ(4,  model);
  EXPECT_FALSE(history.canRedo());
}